

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *includes,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  bool bVar1;
  pointer ppTVar2;
  cmLinkImplItem *this;
  cmGeneratorTarget *pcVar3;
  cmTarget *pcVar4;
  cmLocalGenerator *pcVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  PolicyStatus PVar9;
  pointer ppTVar10;
  undefined4 extraout_var;
  ostream *poVar11;
  cmake *this_00;
  PolicyID id;
  PolicyID id_00;
  pointer filename;
  MessageType MVar12;
  __ireturn_type _Var13;
  allocator<char> local_29d;
  undefined4 local_29c;
  TargetPropertyEntry *local_298;
  string *local_290;
  string local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string usedIncludes;
  cmListFileBacktrace local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string inc;
  
  ppTVar10 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppTVar10 == ppTVar2) {
      return;
    }
    local_298 = *ppTVar10;
    this = local_298->LinkImplItem;
    local_290 = cmLinkItem::AsStr_abi_cxx11_(&this->super_cmLinkItem);
    pcVar3 = (this->super_cmLinkItem).Target;
    if (pcVar3 == (cmGeneratorTarget *)0x0) {
      local_29c = 0;
    }
    else {
      pcVar4 = pcVar3->Target;
      local_29c = (undefined4)CONCAT71((int7)((ulong)pcVar4 >> 8),pcVar4->IsImportedTarget);
    }
    bVar1 = this->FromGenex;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entryIncludes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar8 = (*local_298->_vptr_TargetPropertyEntry[3])
                      (local_298,tgt->LocalGenerator,config,0,tgt,dagChecker,language);
    cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar8),&entryIncludes,false);
    pbVar6 = entryIncludes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    usedIncludes._M_dataplus._M_p = (pointer)&usedIncludes.field_2;
    usedIncludes._M_string_length = 0;
    usedIncludes.field_2._M_local_buf[0] = '\0';
    for (filename = entryIncludes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; filename != pbVar6;
        filename = filename + 1) {
      if (((char)local_29c != '\0') && (bVar7 = cmsys::SystemTools::FileExists(filename), !bVar7)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        MVar12 = FATAL_ERROR;
        if (bVar1 != false) {
          PVar9 = cmGeneratorTarget::GetPolicyStatusCMP0027(tgt);
          if (PVar9 != OLD) {
            if (PVar9 != WARN) goto LAB_00224dc3;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0x1b,id_00);
            poVar11 = std::operator<<((ostream *)&inc,(string *)&local_288);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&local_288);
          }
          MVar12 = AUTHOR_WARNING;
        }
LAB_00224dc3:
        poVar11 = std::operator<<((ostream *)&inc,"Imported target \"");
        poVar11 = std::operator<<(poVar11,(string *)local_290);
        poVar11 = std::operator<<(poVar11,"\" includes non-existent path\n  \"");
        poVar11 = std::operator<<(poVar11,(string *)filename);
        std::operator<<(poVar11,
                        "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                       );
        pcVar5 = tgt->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(pcVar5,MVar12,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        goto LAB_00224e41;
      }
      bVar7 = cmsys::SystemTools::FileIsFullPath(filename);
      if (!bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
        if (local_290->_M_string_length == 0) {
          PVar9 = cmGeneratorTarget::GetPolicyStatusCMP0021(tgt);
          if (PVar9 == OLD) {
            bVar7 = true;
LAB_00224aed:
            MVar12 = FATAL_ERROR;
          }
          else {
            if (PVar9 != WARN) {
              bVar7 = false;
              goto LAB_00224aed;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_288,(cmPolicies *)0x15,id);
            poVar11 = std::operator<<((ostream *)&inc,(string *)&local_288);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&local_288);
            MVar12 = AUTHOR_WARNING;
            bVar7 = false;
          }
          poVar11 = std::operator<<((ostream *)&inc,
                                    "Found relative path while evaluating include directories of \""
                                   );
          poVar11 = std::operator<<(poVar11,(string *)&tgt->Target->Name);
          poVar11 = std::operator<<(poVar11,"\":\n  \"");
          poVar11 = std::operator<<(poVar11,(string *)filename);
          std::operator<<(poVar11,"\"\n");
          if (!bVar7) goto LAB_00224b46;
        }
        else {
          poVar11 = std::operator<<((ostream *)&inc,"Target \"");
          poVar11 = std::operator<<(poVar11,(string *)local_290);
          poVar11 = std::operator<<(poVar11,
                                    "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \""
                                   );
          poVar11 = std::operator<<(poVar11,(string *)filename);
          std::operator<<(poVar11,"\"");
          MVar12 = FATAL_ERROR;
LAB_00224b46:
          pcVar5 = tgt->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar5,MVar12,&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          if (MVar12 == FATAL_ERROR) {
LAB_00224e41:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
            std::__cxx11::string::~string((string *)&usedIncludes);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entryIncludes);
            return;
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
      }
      bVar7 = cmSystemTools::IsOff(filename);
      if (!bVar7) {
        cmsys::SystemTools::ConvertToUnixSlashes(filename);
      }
      std::__cxx11::string::string((string *)&inc,(string *)filename);
      _Var13 = std::__detail::
               _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)uniqueIncludes,&inc);
      if (((undefined1  [16])_Var13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*local_298->_vptr_TargetPropertyEntry[4])(&local_288);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   includes,&inc,(cmListFileBacktrace *)&local_288);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_288._M_string_length);
        if (debugIncludes) {
          std::operator+(&local_1e8," * ",&inc);
          std::operator+(&local_288,&local_1e8,"\n");
          std::__cxx11::string::append((string *)&usedIncludes);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
      }
      std::__cxx11::string::~string((string *)&inc);
    }
    if (usedIncludes._M_string_length != 0) {
      this_00 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Used includes for target ",&local_29d);
      std::operator+(&local_1e8,&local_1c8,&tgt->Target->Name);
      std::operator+(&local_288,&local_1e8,":\n");
      std::operator+(&inc,&local_288,&usedIncludes);
      (*local_298->_vptr_TargetPropertyEntry[4])(&local_1f8);
      cmake::IssueMessage(this_00,LOG,&inc,&local_1f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1f8.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&inc);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::string::~string((string *)&usedIncludes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entryIncludes);
    ppTVar10 = ppTVar10 + 1;
  } while( true );
}

Assistant:

static void processIncludeDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& includes,
  std::unordered_set<std::string>& uniqueIncludes,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugIncludes, const std::string& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryIncludes);

    std::string usedIncludes;
    for (std::string& entryInclude : entryIncludes) {
      if (fromImported && !cmSystemTools::FileExists(entryInclude)) {
        std::ostringstream e;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (checkCMP0027) {
          switch (tgt->GetPolicyStatusCMP0027()) {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
              CM_FALLTHROUGH;
            case cmPolicies::OLD:
              messageType = MessageType::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
        /* clang-format off */
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << entryInclude << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        /* clang-format on */
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
      }

      if (!cmSystemTools::FileIsFullPath(entryInclude)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << entryInclude << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0021()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating include directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryInclude << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      if (!cmSystemTools::IsOff(entryInclude)) {
        cmSystemTools::ConvertToUnixSlashes(entryInclude);
      }
      std::string inc = entryInclude;

      if (uniqueIncludes.insert(inc).second) {
        includes.emplace_back(inc, entry->GetBacktrace());
        if (debugIncludes) {
          usedIncludes += " * " + inc + "\n";
        }
      }
    }
    if (!usedIncludes.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used includes for target ") + tgt->GetName() + ":\n" +
          usedIncludes,
        entry->GetBacktrace());
    }
  }
}